

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O3

void xmlSchemaComponentListFree(xmlSchemaItemListPtr list)

{
  xmlSchemaTypeType type;
  void **ppvVar1;
  xmlSchemaTypePtr type_00;
  xmlSchemaTypePtr pxVar2;
  _xmlSchemaAnnot *p_Var3;
  _xmlSchemaAnnot *p_Var4;
  xmlSchemaTypePtr pxVar5;
  _xmlSchemaType *p_Var6;
  undefined8 *puVar7;
  undefined8 *puVar8;
  char *extra;
  long lVar9;
  xmlSchemaAnnotPtr pxVar10;
  xmlSchemaAttributePtr_conflict pxVar11;
  
  if (list->nbItems != 0) {
    if (0 < list->nbItems) {
      ppvVar1 = list->items;
      lVar9 = 0;
      do {
        type_00 = (xmlSchemaTypePtr)ppvVar1[lVar9];
        if (type_00 == (xmlSchemaTypePtr)0x0) goto LAB_001b6b29;
        type = type_00->type;
        switch(type) {
        case XML_SCHEMA_TYPE_BASIC:
          extra = "simple type definition";
          if (type_00->builtInType == 0x2d) {
            extra = "complex type definition";
          }
          goto LAB_001b6a52;
        case XML_SCHEMA_TYPE_ANY:
        case XML_SCHEMA_TYPE_ANY_ATTRIBUTE:
          xmlSchemaFreeWildcard((xmlSchemaWildcardPtr)type_00);
          goto LAB_001b6b29;
        case XML_SCHEMA_TYPE_FACET:
        case XML_SCHEMA_TYPE_SIMPLE_CONTENT:
        case XML_SCHEMA_TYPE_COMPLEX_CONTENT:
        case XML_SCHEMA_TYPE_UR:
        case XML_SCHEMA_TYPE_RESTRICTION:
        case XML_SCHEMA_TYPE_EXTENSION:
        case XML_SCHEMA_TYPE_LIST:
        case XML_SCHEMA_TYPE_UNION:
          goto switchD_001b689b_caseD_3;
        case XML_SCHEMA_TYPE_SIMPLE:
        case XML_SCHEMA_TYPE_COMPLEX:
          xmlSchemaFreeType(type_00);
          goto LAB_001b6b29;
        case XML_SCHEMA_TYPE_SEQUENCE:
        case XML_SCHEMA_TYPE_CHOICE:
        case XML_SCHEMA_TYPE_ALL:
          p_Var6 = type_00->next;
          if (p_Var6 != (_xmlSchemaType *)0x0) {
            puVar7 = *(undefined8 **)p_Var6;
            (*xmlFree)(p_Var6);
            while (puVar7 != (undefined8 *)0x0) {
              puVar8 = (undefined8 *)*puVar7;
              (*xmlFree)(puVar7);
              puVar7 = puVar8;
            }
          }
          break;
        case XML_SCHEMA_TYPE_ELEMENT:
          pxVar10 = type_00->annot;
          if (pxVar10 != (xmlSchemaAnnotPtr)0x0) {
            p_Var3 = pxVar10->next;
            (*xmlFree)(pxVar10);
            while (p_Var3 != (_xmlSchemaAnnot *)0x0) {
              p_Var4 = p_Var3->next;
              (*xmlFree)(p_Var3);
              p_Var3 = p_Var4;
            }
          }
          if (*(xmlRegexpPtr *)&type_00->builtInType != (xmlRegexpPtr)0x0) {
            xmlRegFreeRegexp(*(xmlRegexpPtr *)&type_00->builtInType);
          }
          if ((xmlSchemaValPtr)type_00->refPrefix != (xmlSchemaValPtr)0x0) {
            xmlSchemaFreeValue((xmlSchemaValPtr)type_00->refPrefix);
          }
        case XML_SCHEMA_TYPE_NOTATION:
switchD_001b689b_caseD_12:
          (*xmlFree)(type_00);
          goto LAB_001b6b29;
        case XML_SCHEMA_TYPE_ATTRIBUTE:
          pxVar11 = type_00->attributes;
          if (pxVar11 != (xmlSchemaAttributePtr_conflict)0x0) {
            puVar7 = *(undefined8 **)pxVar11;
            (*xmlFree)(pxVar11);
            while (puVar7 != (undefined8 *)0x0) {
              puVar8 = (undefined8 *)*puVar7;
              (*xmlFree)(puVar7);
              puVar7 = puVar8;
            }
          }
          pxVar11 = *(xmlSchemaAttributePtr_conflict *)&type_00->recurse;
          goto LAB_001b6a99;
        case XML_SCHEMA_TYPE_ATTRIBUTEGROUP:
          pxVar10 = type_00->annot;
          if (pxVar10 != (xmlSchemaAnnotPtr)0x0) {
            p_Var3 = pxVar10->next;
            (*xmlFree)(pxVar10);
            while (p_Var3 != (_xmlSchemaAnnot *)0x0) {
              p_Var4 = p_Var3->next;
              (*xmlFree)(p_Var3);
              p_Var3 = p_Var4;
            }
          }
          pxVar5 = type_00->baseType;
          if (pxVar5 != (xmlSchemaTypePtr)0x0) {
            if (*(void **)pxVar5 != (void *)0x0) {
              (*xmlFree)(*(void **)pxVar5);
            }
            (*xmlFree)(pxVar5);
          }
          break;
        case XML_SCHEMA_TYPE_GROUP:
          p_Var6 = type_00->next;
          if (p_Var6 != (_xmlSchemaType *)0x0) {
            puVar7 = *(undefined8 **)p_Var6;
            (*xmlFree)(p_Var6);
            while (puVar7 != (undefined8 *)0x0) {
              puVar8 = (undefined8 *)*puVar7;
              (*xmlFree)(puVar7);
              puVar7 = puVar8;
            }
          }
          break;
        case XML_SCHEMA_TYPE_IDC_UNIQUE:
        case XML_SCHEMA_TYPE_IDC_KEY:
        case XML_SCHEMA_TYPE_IDC_KEYREF:
          p_Var6 = type_00->next;
          if (p_Var6 != (_xmlSchemaType *)0x0) {
            puVar7 = *(undefined8 **)p_Var6;
            (*xmlFree)(p_Var6);
            while (puVar7 != (undefined8 *)0x0) {
              puVar8 = (undefined8 *)*puVar7;
              (*xmlFree)(puVar7);
              puVar7 = puVar8;
            }
          }
          pxVar10 = type_00->annot;
          if (pxVar10 != (xmlSchemaAnnotPtr)0x0) {
            if ((xmlPatternPtr)pxVar10[2].next != (xmlPatternPtr)0x0) {
              xmlFreePattern((xmlPatternPtr)pxVar10[2].next);
              pxVar10 = type_00->annot;
            }
            (*xmlFree)(pxVar10);
          }
          pxVar5 = type_00->subtypes;
          while (pxVar5 != (xmlSchemaTypePtr)0x0) {
            pxVar2 = *(xmlSchemaTypePtr *)pxVar5;
            if ((xmlPatternPtr)pxVar5->ref != (xmlPatternPtr)0x0) {
              xmlFreePattern((xmlPatternPtr)pxVar5->ref);
            }
            (*xmlFree)(pxVar5);
            pxVar5 = pxVar2;
          }
          break;
        case XML_SCHEMA_TYPE_PARTICLE:
          p_Var6 = type_00->next;
          if (p_Var6 != (_xmlSchemaType *)0x0) {
            puVar7 = *(undefined8 **)p_Var6;
            (*xmlFree)(p_Var6);
            while (puVar7 != (undefined8 *)0x0) {
              puVar8 = (undefined8 *)*puVar7;
              (*xmlFree)(puVar7);
              puVar7 = puVar8;
            }
          }
          break;
        case XML_SCHEMA_TYPE_ATTRIBUTE_USE:
          p_Var6 = type_00->next;
          if (p_Var6 != (_xmlSchemaType *)0x0) {
            puVar7 = *(undefined8 **)p_Var6;
            (*xmlFree)(p_Var6);
            while (puVar7 != (undefined8 *)0x0) {
              puVar8 = (undefined8 *)*puVar7;
              (*xmlFree)(puVar7);
              puVar7 = puVar8;
            }
          }
          pxVar11 = type_00->attributes;
LAB_001b6a99:
          if (pxVar11 != (xmlSchemaAttributePtr_conflict)0x0) {
            xmlSchemaFreeValue((xmlSchemaValPtr)pxVar11);
          }
          break;
        default:
          if ((type == XML_SCHEMA_EXTRA_QNAMEREF) || (type == XML_SCHEMA_EXTRA_ATTR_USE_PROHIB))
          goto switchD_001b689b_caseD_12;
          goto switchD_001b689b_caseD_3;
        }
        (*xmlFree)(type_00);
LAB_001b6b29:
        lVar9 = lVar9 + 1;
      } while (lVar9 < list->nbItems);
    }
    list->nbItems = 0;
  }
  return;
switchD_001b689b_caseD_3:
  extra = (char *)xmlSchemaItemTypeToStr(type);
LAB_001b6a52:
  __xmlSimpleError(0x10,0xbfd,(xmlNodePtr)0x0,
                   "Internal error: xmlSchemaComponentListFree, unexpected component type \'%s\'\n",
                   extra);
  goto LAB_001b6b29;
}

Assistant:

static void
xmlSchemaComponentListFree(xmlSchemaItemListPtr list)
{
    if ((list == NULL) || (list->nbItems == 0))
	return;
    {
	xmlSchemaTreeItemPtr item;
	xmlSchemaTreeItemPtr *items = (xmlSchemaTreeItemPtr *) list->items;
	int i;

	for (i = 0; i < list->nbItems; i++) {
	    item = items[i];
	    if (item == NULL)
		continue;
	    switch (item->type) {
		case XML_SCHEMA_TYPE_SIMPLE:
		case XML_SCHEMA_TYPE_COMPLEX:
		    xmlSchemaFreeType((xmlSchemaTypePtr) item);
		    break;
		case XML_SCHEMA_TYPE_ATTRIBUTE:
		    xmlSchemaFreeAttribute((xmlSchemaAttributePtr) item);
		    break;
		case XML_SCHEMA_TYPE_ATTRIBUTE_USE:
		    xmlSchemaFreeAttributeUse((xmlSchemaAttributeUsePtr) item);
		    break;
		case XML_SCHEMA_EXTRA_ATTR_USE_PROHIB:
		    xmlSchemaFreeAttributeUseProhib(
			(xmlSchemaAttributeUseProhibPtr) item);
		    break;
		case XML_SCHEMA_TYPE_ELEMENT:
		    xmlSchemaFreeElement((xmlSchemaElementPtr) item);
		    break;
		case XML_SCHEMA_TYPE_PARTICLE:
		    if (item->annot != NULL)
			xmlSchemaFreeAnnot(item->annot);
		    xmlFree(item);
		    break;
		case XML_SCHEMA_TYPE_SEQUENCE:
		case XML_SCHEMA_TYPE_CHOICE:
		case XML_SCHEMA_TYPE_ALL:
		    xmlSchemaFreeModelGroup((xmlSchemaModelGroupPtr) item);
		    break;
		case XML_SCHEMA_TYPE_ATTRIBUTEGROUP:
		    xmlSchemaFreeAttributeGroup(
			(xmlSchemaAttributeGroupPtr) item);
		    break;
		case XML_SCHEMA_TYPE_GROUP:
		    xmlSchemaFreeModelGroupDef(
			(xmlSchemaModelGroupDefPtr) item);
		    break;
		case XML_SCHEMA_TYPE_ANY:
		case XML_SCHEMA_TYPE_ANY_ATTRIBUTE:
		    xmlSchemaFreeWildcard((xmlSchemaWildcardPtr) item);
		    break;
		case XML_SCHEMA_TYPE_IDC_KEY:
		case XML_SCHEMA_TYPE_IDC_UNIQUE:
		case XML_SCHEMA_TYPE_IDC_KEYREF:
		    xmlSchemaFreeIDC((xmlSchemaIDCPtr) item);
		    break;
		case XML_SCHEMA_TYPE_NOTATION:
		    xmlSchemaFreeNotation((xmlSchemaNotationPtr) item);
		    break;
		case XML_SCHEMA_EXTRA_QNAMEREF:
		    xmlSchemaFreeQNameRef((xmlSchemaQNameRefPtr) item);
		    break;
		default: {
		    /* TODO: This should never be hit. */
		    xmlSchemaPSimpleInternalErr(NULL,
			"Internal error: xmlSchemaComponentListFree, "
			"unexpected component type '%s'\n",
			(const xmlChar *) WXS_ITEM_TYPE_NAME(item));
			 }
		    break;
	    }
	}
	list->nbItems = 0;
    }
}